

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O3

void GraphTask::run_bfs(task_data *D,multi_ex *ec)

{
  pointer *ppuVar1;
  int iVar2;
  iterator iVar3;
  pointer pvVar4;
  unsigned_long uVar5;
  pointer ppeVar6;
  pointer puVar7;
  uint uVar8;
  wclass *pwVar9;
  pointer puVar10;
  size_t n;
  ulong uVar11;
  ulong uVar12;
  pointer puVar13;
  ulong uVar14;
  long lVar15;
  uint local_84;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_80;
  task_data *local_78;
  multi_ex *local_70;
  ulong local_68;
  pointer local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  puVar7 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  local_80 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&D->bfs;
  uVar11 = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_70 = ec;
  do {
    std::vector<bool,_std::allocator<bool>_>::push_back(&local_58,false);
    uVar11 = uVar11 + 1;
  } while (uVar11 < D->N);
  *local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
   super__Bit_iterator_base._M_p =
       *local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p | 1;
  local_84 = 0;
  iVar3._M_current =
       (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,iVar3,&local_84);
    puVar7 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = 0;
    puVar7 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
    (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  puVar10 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar11 = (ulong)D->N;
  if ((ulong)((long)puVar7 - (long)puVar10 >> 2) < uVar11) {
    uVar12 = 0;
    local_78 = D;
    do {
      uVar14 = (long)puVar7 - (long)puVar10 >> 2;
      if (uVar12 < uVar14) {
        do {
          pvVar4 = (D->adj).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar13 = pvVar4[puVar10[uVar12]].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_60 = *(pointer *)
                      ((long)&pvVar4[puVar10[uVar12]].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data + 8);
          if (puVar13 != local_60) {
            ppeVar6 = (local_70->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_68 = uVar12;
            do {
              uVar5 = *puVar13;
              pwVar9 = (ppeVar6[uVar5]->l).cs.costs._begin;
              if ((ppeVar6[uVar5]->l).cs.costs._end != pwVar9) {
                lVar15 = 4;
                uVar11 = 0;
                do {
                  iVar2 = *(int *)((long)&pwVar9->x + lVar15);
                  if (iVar2 != 0) {
                    uVar8 = iVar2 - 1;
                    if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8 >> 6]
                         >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
                      iVar3._M_current =
                           (local_78->bfs).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      local_84 = uVar8;
                      if (iVar3._M_current ==
                          (local_78->bfs).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                                   iVar3,&local_84);
                      }
                      else {
                        *iVar3._M_current = uVar8;
                        ppuVar1 = &(local_78->bfs).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish;
                        *ppuVar1 = *ppuVar1 + 1;
                      }
                      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] =
                           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar8 >> 6] | 1L << ((byte)uVar8 & 0x3f);
                      ppeVar6 = (local_70->super__Vector_base<example_*,_std::allocator<example_*>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                    }
                  }
                  uVar11 = uVar11 + 1;
                  pwVar9 = (ppeVar6[uVar5]->l).cs.costs._begin;
                  lVar15 = lVar15 + 0x10;
                } while (uVar11 < (ulong)((long)(ppeVar6[uVar5]->l).cs.costs._end - (long)pwVar9 >>
                                         4));
              }
              puVar13 = puVar13 + 1;
            } while (puVar13 != local_60);
            puVar10 = (local_78->bfs).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar7 = (local_78->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar12 = local_68;
            D = local_78;
          }
          uVar12 = uVar12 + 1;
          uVar14 = (long)puVar7 - (long)puVar10 >> 2;
        } while (uVar12 < uVar14);
        uVar11 = (ulong)D->N;
      }
      if (uVar14 < uVar11) {
        uVar14 = 0;
        do {
          uVar8 = (uint)uVar14;
          if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] =
                 local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] |
                 1L << ((byte)uVar14 & 0x3f);
            iVar3._M_current =
                 (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_84 = uVar8;
            if (iVar3._M_current ==
                (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_80,iVar3,&local_84);
              puVar7 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              *iVar3._M_current = uVar8;
              puVar7 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
              (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar7;
            }
            break;
          }
          uVar14 = (ulong)(uVar8 + 1);
        } while ((uint)uVar11 != uVar8 + 1);
        puVar10 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = (ulong)D->N;
      }
    } while ((ulong)((long)puVar7 - (long)puVar10 >> 2) < uVar11);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void run_bfs(task_data& D, multi_ex& ec)
{
  D.bfs.clear();
  vector<bool> touched;
  for (size_t n = 0; n < D.N; n++) touched.push_back(false);

  touched[0] = true;
  D.bfs.push_back(0);

  size_t i = 0;
  while (D.bfs.size() < D.N)
  {
    while (i < D.bfs.size())
    {
      uint32_t n = D.bfs[i];
      for (size_t id : D.adj[n])
        for (size_t j = 0; j < ec[id]->l.cs.costs.size(); j++)
        {
          uint32_t m = ec[id]->l.cs.costs[j].class_index;
          if ((m > 0) && (!touched[m - 1]))
          {
            D.bfs.push_back(m - 1);
            touched[m - 1] = true;
          }
        }
      i++;
    }

    if (D.bfs.size() < D.N)
      // we finished a SCC, need to find another
      for (uint32_t n = 0; n < D.N; n++)
        if (!touched[n])
        {
          touched[n] = true;
          D.bfs.push_back(n);
          break;
        }
  }
}